

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

char * __thiscall
ASDCP::MXF::UTF16String::EncodeString(UTF16String *this,char *str_buf,ui32_t buf_len)

{
  uint uVar1;
  char *__src;
  ui32_t write_len;
  ui32_t buf_len_local;
  char *str_buf_local;
  UTF16String *this_local;
  
  uVar1 = std::__cxx11::string::size();
  uVar1 = Kumu::xmin<unsigned_int>(buf_len - 1,uVar1);
  __src = (char *)std::__cxx11::string::c_str();
  strncpy(str_buf,__src,(ulong)uVar1);
  str_buf[uVar1] = '\0';
  return str_buf;
}

Assistant:

const char*
ASDCP::MXF::UTF16String::EncodeString(char* str_buf, ui32_t buf_len) const
{
  ui32_t write_len = Kumu::xmin(buf_len - 1, (ui32_t)size());
  strncpy(str_buf, c_str(), write_len);
  str_buf[write_len] = 0;
  return str_buf;
}